

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funchook.c
# Opt level: O0

void funchook_log_end(funchook_t *funchook,char *fmt,...)

{
  funchook_t *in_RCX;
  undefined8 in_RDX;
  long in_RDI;
  va_list ap;
  __va_list_tag *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff30;
  
  funchook_logv(in_RCX,(int)((ulong)in_RDX >> 0x20),in_stack_ffffffffffffff30,
                in_stack_ffffffffffffff28);
  if ((in_RDI != 0) && (*(long *)(in_RDI + 0xd8) != 0)) {
    fclose(*(FILE **)(in_RDI + 0xd8));
    *(undefined8 *)(in_RDI + 0xd8) = 0;
  }
  return;
}

Assistant:

static void funchook_log_end(funchook_t *funchook, const char *fmt, ...)
{
    va_list ap;
    va_start(ap, fmt);
    funchook_logv(funchook, 0, fmt, ap);
    va_end(ap);
    if (funchook != NULL && funchook->fp != NULL) {
        fclose(funchook->fp);
        funchook->fp = NULL;
    }
}